

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReactorNull.cpp
# Opt level: O0

int __thiscall pele::physics::reactions::ReactorNull::init(ReactorNull *this,EVP_PKEY_CTX *ctx)

{
  ParmParse pp;
  int in_stack_ffffffffffffff4c;
  string *prefix;
  ParmParse *in_stack_ffffffffffffff60;
  undefined1 local_89 [85];
  int in_stack_ffffffffffffffcc;
  int *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  ParmParse *in_stack_ffffffffffffffe0;
  
  this->m_reactor_type = (int)ctx;
  ReactorTypes::check_reactor_type(in_stack_ffffffffffffff4c);
  prefix = (string *)local_89;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_89 + 1),"ode",(allocator *)prefix);
  amrex::ParmParse::ParmParse(in_stack_ffffffffffffff60,prefix);
  std::__cxx11::string::~string((string *)(local_89 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_89);
  amrex::ParmParse::query
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
             in_stack_ffffffffffffffcc);
  amrex::ParmParse::~ParmParse((ParmParse *)0x430436);
  return 0;
}

Assistant:

int
ReactorNull::init(int reactor_type, int /*ncells*/)
{
  BL_PROFILE("Pele::ReactorNull::init()");
  m_reactor_type = reactor_type;
  ReactorTypes::check_reactor_type(m_reactor_type);
  amrex::ParmParse pp("ode");
  pp.query("verbose", verbose);
  return (0);
}